

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

void __thiscall Minisat::Solver::uncheckedEnqueue(Solver *this,Lit p,CRef from)

{
  byte bVar1;
  lbool *plVar2;
  int iVar3;
  VarData VVar4;
  byte bVar5;
  Lit local_c;
  
  iVar3 = p.x >> 1;
  local_c.x = p.x;
  if ((this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.sz <=
      iVar3) {
    __assert_fail("has(k)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/mtl/IntMap.h"
                  ,0x27,
                  "const V &Minisat::IntMap<int, Minisat::lbool>::operator[](K) const [K = int, V = Minisat::lbool, MkIndex = Minisat::MkIndexDefault<int>]"
                 );
  }
  plVar2 = (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.data
  ;
  bVar1 = plVar2[iVar3].value;
  bVar5 = (byte)p.x & 1;
  if ((bVar1 ^ bVar5) == l_Undef && (l_Undef & 2) == 0 || (l_Undef & 2 & bVar1) != 0) {
    plVar2[iVar3].value = bVar5;
    if (iVar3 < (this->vardata).
                super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.sz) {
      VVar4.level = (this->trail_lim).sz;
      VVar4.reason = from;
      (this->vardata).super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map
      .data[iVar3] = VVar4;
      vec<Minisat::Lit,_int>::push_(&this->trail,&local_c);
      return;
    }
    __assert_fail("has(k)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/mtl/IntMap.h"
                  ,0x28,
                  "V &Minisat::IntMap<int, Minisat::Solver::VarData>::operator[](K) [K = int, V = Minisat::Solver::VarData, MkIndex = Minisat::MkIndexDefault<int>]"
                 );
  }
  __assert_fail("value(p) == l_Undef",
                "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/core/Solver.cc"
                ,0x1e8,"void Minisat::Solver::uncheckedEnqueue(Lit, CRef)");
}

Assistant:

void Solver::uncheckedEnqueue(Lit p, CRef from)
{
    assert(value(p) == l_Undef);
    assigns[var(p)] = lbool(!sign(p));
    vardata[var(p)] = mkVarData(from, decisionLevel());
    trail.push_(p);
}